

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O1

void lrit::to_json(json *j,SegmentIdentificationHeader *h)

{
  value_t t;
  json_value jVar1;
  long lVar2;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  initializer_list_t init_03;
  initializer_list_t init_04;
  initializer_list_t init_05;
  initializer_list_t init_06;
  undefined1 local_2e0 [8];
  json_value local_2d8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_2d0;
  value_t local_2b0 [8];
  ulong local_2a8;
  value_t *local_2a0;
  undefined1 local_298;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_290;
  value_t local_270 [8];
  ulong local_268;
  value_t *local_260;
  undefined1 local_258;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_250;
  value_t local_230 [8];
  ulong local_228;
  value_t *local_220;
  undefined1 local_218;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_210;
  value_t local_1f0 [8];
  ulong local_1e8;
  value_t *local_1e0;
  undefined1 local_1d8;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_1d0;
  value_t local_1b0 [8];
  ulong local_1a8;
  value_t *local_1a0;
  undefined1 local_198;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_190;
  value_t local_170 [8];
  ulong local_168;
  value_t *local_160;
  undefined1 local_158;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_150;
  value_t local_130 [8];
  ulong local_128;
  value_t *local_120;
  undefined1 local_118;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_110;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_e0;
  undefined1 local_d8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_d0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_c0;
  undefined1 local_b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_a0;
  undefined1 local_98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_80;
  undefined1 local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_60;
  undefined1 local_58;
  undefined1 local_50 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_40;
  undefined1 local_38;
  
  local_150.owned_value.m_value.object = (object_t *)0x0;
  local_150.owned_value.m_type = string;
  local_150.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[16]>((char (*) [16])"ImageIdentifier");
  local_150.value_ref = &local_150.owned_value;
  local_150.is_rvalue = true;
  local_120 = local_130;
  local_128 = (ulong)h->imageIdentifier;
  local_130[0] = number_unsigned;
  local_118 = 1;
  init._M_len = 2;
  init._M_array = (iterator)local_150.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_110.owned_value,init,true,array);
  local_110.value_ref = &local_110.owned_value;
  local_110.is_rvalue = true;
  local_190.owned_value.m_value.object = (object_t *)0x0;
  local_190.owned_value.m_type = string;
  local_190.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[14]>((char (*) [14])"SegmentNumber");
  local_190.value_ref = &local_190.owned_value;
  local_190.is_rvalue = true;
  local_160 = local_170;
  local_168 = (ulong)h->segmentNumber;
  local_170[0] = number_unsigned;
  local_158 = 1;
  init_00._M_len = 2;
  init_00._M_array = (iterator)local_190.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_f0,init_00,true,array);
  local_d8 = 1;
  local_1d0.owned_value.m_value.object = (object_t *)0x0;
  local_1d0.owned_value.m_type = string;
  local_e0 = &local_f0;
  local_1d0.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[19]>((char (*) [19])"SegmentStartColumn");
  local_1d0.value_ref = &local_1d0.owned_value;
  local_1d0.is_rvalue = true;
  local_1a0 = local_1b0;
  local_1a8 = (ulong)h->segmentStartColumn;
  local_1b0[0] = number_unsigned;
  local_198 = 1;
  init_01._M_len = 2;
  init_01._M_array = (iterator)local_1d0.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_d0,init_01,true,array);
  local_b8 = 1;
  local_210.owned_value.m_value.object = (object_t *)0x0;
  local_210.owned_value.m_type = string;
  local_c0 = &local_d0;
  local_210.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[17]>((char (*) [17])"SegmentStartLine");
  local_210.value_ref = &local_210.owned_value;
  local_210.is_rvalue = true;
  local_1e0 = local_1f0;
  local_1e8 = (ulong)h->segmentStartLine;
  local_1f0[0] = number_unsigned;
  local_1d8 = 1;
  init_02._M_len = 2;
  init_02._M_array = (iterator)local_210.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_b0,init_02,true,array);
  local_98 = 1;
  local_250.owned_value.m_value.object = (object_t *)0x0;
  local_250.owned_value.m_type = string;
  local_a0 = &local_b0;
  local_250.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[11]>((char (*) [11])"MaxSegment");
  local_250.value_ref = &local_250.owned_value;
  local_250.is_rvalue = true;
  local_220 = local_230;
  local_228 = (ulong)h->maxSegment;
  local_230[0] = number_unsigned;
  local_218 = 1;
  init_03._M_len = 2;
  init_03._M_array = (iterator)local_250.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_90,init_03,true,array);
  local_78 = 1;
  local_290.owned_value.m_value.object = (object_t *)0x0;
  local_290.owned_value.m_type = string;
  local_80 = &local_90;
  local_290.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[10]>((char (*) [10])"MaxColumn");
  local_290.value_ref = &local_290.owned_value;
  local_290.is_rvalue = true;
  local_260 = local_270;
  local_268 = (ulong)h->maxColumn;
  local_270[0] = number_unsigned;
  local_258 = 1;
  init_04._M_len = 2;
  init_04._M_array = (iterator)local_290.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_70,init_04,true,array);
  local_58 = 1;
  local_2d0.owned_value.m_value.object = (object_t *)0x0;
  local_2d0.owned_value.m_type = string;
  local_60 = &local_70;
  local_2d0.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[8]>((char (*) [8])"MaxLine");
  local_2d0.value_ref = &local_2d0.owned_value;
  local_2d0.is_rvalue = true;
  local_2a0 = local_2b0;
  local_2a8 = (ulong)h->maxLine;
  local_2b0[0] = number_unsigned;
  local_298 = 1;
  init_05._M_len = 2;
  init_05._M_array = (iterator)local_2d0.value_ref;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_50,init_05,true,array);
  local_38 = 1;
  init_06._M_len = 7;
  init_06._M_array = &local_110;
  local_40 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_50;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_2e0,init_06,true,array);
  t = j->m_type;
  j->m_type = local_2e0[0];
  jVar1 = j->m_value;
  j->m_value = local_2d8;
  local_2e0[0] = t;
  local_2d8 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_2e0 + 8),t);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_50 + lVar2 + 8),local_50[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0xe0);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_2a8 + lVar2),local_2b0[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_268 + lVar2),local_270[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_228 + lVar2),local_230[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_1e8 + lVar2),local_1f0[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_1a8 + lVar2),local_1b0[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_168 + lVar2),local_170[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  lVar2 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_128 + lVar2),local_130[lVar2]);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return;
}

Assistant:

void to_json(json& j, const SegmentIdentificationHeader& h) {
  j = {
      {"ImageIdentifier", h.imageIdentifier},
      {"SegmentNumber", h.segmentNumber},
      {"SegmentStartColumn", h.segmentStartColumn},
      {"SegmentStartLine", h.segmentStartLine},
      {"MaxSegment", h.maxSegment},
      {"MaxColumn", h.maxColumn},
      {"MaxLine", h.maxLine},
  };
}